

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-getaddrinfo.c
# Opt level: O1

int run_test_getaddrinfo_fail(void)

{
  int iVar1;
  int extraout_EAX;
  int iVar2;
  undefined8 uVar3;
  uv_getaddrinfo_t *puVar4;
  undefined4 *puVar5;
  int *piVar6;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  undefined8 unaff_RBX;
  size_t *psVar7;
  undefined8 *puVar8;
  int *piVar9;
  long lVar10;
  uv_getaddrinfo_t req;
  undefined1 auStack_210 [144];
  undefined8 uStack_180;
  code *pcStack_170;
  code *pcStack_168;
  code *pcStack_160;
  undefined1 auStack_158 [144];
  undefined8 uStack_c8;
  code *pcStack_b8;
  code *pcStack_b0;
  undefined1 auStack_a8 [160];
  
  iVar2 = (int)auStack_a8;
  pcStack_b0 = (code *)0x15b641;
  uVar3 = uv_default_loop();
  pcStack_b0 = (code *)0x15b65b;
  iVar1 = uv_getaddrinfo(uVar3,auStack_a8,abort,0,0,0);
  if (iVar1 == -0x16) {
    pcStack_b0 = (code *)0x15b669;
    uVar3 = uv_default_loop();
    pcStack_b0 = (code *)0x15b688;
    iVar2 = (int)auStack_a8;
    iVar1 = uv_getaddrinfo(uVar3,auStack_a8,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar1 != 0) goto LAB_0015b6ec;
    pcStack_b0 = (code *)0x15b691;
    uVar3 = uv_default_loop();
    iVar2 = 0;
    pcStack_b0 = (code *)0x15b69b;
    iVar1 = uv_run(uVar3);
    if (iVar1 != 0) goto LAB_0015b6f1;
    if (fail_cb_called != 1) goto LAB_0015b6f6;
    pcStack_b0 = (code *)0x15b6ad;
    unaff_RBX = uv_default_loop();
    pcStack_b0 = (code *)0x15b6c1;
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar2 = 0;
    pcStack_b0 = (code *)0x15b6cb;
    uv_run(unaff_RBX);
    pcStack_b0 = (code *)0x15b6d0;
    uVar3 = uv_default_loop();
    pcStack_b0 = (code *)0x15b6d8;
    iVar1 = uv_loop_close(uVar3);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x15b6ec;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b6ec:
    pcStack_b0 = (code *)0x15b6f1;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b6f1:
    pcStack_b0 = (code *)0x15b6f6;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b6f6:
    pcStack_b0 = (code *)0x15b6fb;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_b0 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar2) goto LAB_0015b727;
    if (extraout_RDX == 0) {
      pcStack_b8 = (code *)0x15b71a;
      pcStack_b0._0_4_ = extraout_EAX;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_b0;
    }
  }
  else {
    pcStack_b8 = (code *)0x15b727;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b727:
    pcStack_b8 = (code *)0x15b72c;
    getaddrinfo_fail_cb_cold_2();
  }
  pcStack_b8 = run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  pcStack_160 = (code *)0x15b73e;
  pcStack_b8 = (code *)unaff_RBX;
  uVar3 = uv_default_loop();
  pcStack_160 = (code *)0x15b758;
  iVar2 = uv_getaddrinfo(uVar3,auStack_158,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar2 < 0) {
    pcStack_160 = (code *)0x15b769;
    uv_freeaddrinfo(uStack_c8);
    pcStack_160 = (code *)0x15b76e;
    unaff_RBX = uv_default_loop();
    pcStack_160 = (code *)0x15b782;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_160 = (code *)0x15b78c;
    uv_run(unaff_RBX,0);
    pcStack_160 = (code *)0x15b791;
    uVar3 = uv_default_loop();
    pcStack_160 = (code *)0x15b799;
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_160 = (code *)0x15b7ad;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  pcStack_160 = run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  pcStack_168 = (code *)0x15b7bd;
  pcStack_160 = (code *)unaff_RBX;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  pcStack_168 = (code *)0x15b7c9;
  puVar4 = (uv_getaddrinfo_t *)uv_default_loop();
  pcStack_168 = (code *)0x15b7ec;
  iVar2 = uv_getaddrinfo(puVar4,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar2 == 0) {
    pcStack_168 = (code *)0x15b7f5;
    puVar4 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_168 = (code *)0x15b7ff;
    uv_run(puVar4,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b845;
    pcStack_168 = (code *)0x15b80d;
    unaff_RBX = uv_default_loop();
    pcStack_168 = (code *)0x15b821;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_168 = (code *)0x15b82b;
    uv_run(unaff_RBX,0);
    pcStack_168 = (code *)0x15b830;
    puVar4 = (uv_getaddrinfo_t *)uv_default_loop();
    pcStack_168 = (code *)0x15b838;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_168 = (code *)0x15b845;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b845:
    pcStack_168 = (code *)0x15b84a;
    run_test_getaddrinfo_basic_cold_2();
  }
  pcStack_168 = getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  pcStack_168 = (code *)unaff_RBX;
  if (getaddrinfo_handle == puVar4) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    pcStack_170 = (code *)0x15b867;
    free(puVar4);
    iVar2 = uv_freeaddrinfo(extraout_RDX_00);
    return iVar2;
  }
  pcStack_170 = run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  pcStack_170 = (code *)unaff_RBX;
  uVar3 = uv_default_loop();
  iVar2 = uv_getaddrinfo(uVar3,auStack_210,0,"localhost",0,0);
  if (iVar2 == 0) {
    uv_freeaddrinfo(uStack_180);
    unaff_RBX = uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar3 = uv_default_loop();
    iVar2 = uv_loop_close(uVar3);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar4 = getaddrinfo_handles;
  piVar9 = callback_counts;
  lVar10 = 0;
  do {
    *piVar9 = 0;
    puVar8 = (undefined8 *)0x4;
    puVar5 = (undefined4 *)malloc(4);
    if (puVar5 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b9e4:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b9e9;
    }
    *puVar5 = (int)lVar10;
    puVar4->data = puVar5;
    puVar8 = (undefined8 *)uv_default_loop();
    iVar2 = uv_getaddrinfo(puVar8,puVar4,getaddrinfo_cuncurrent_cb,"localhost",0,0,unaff_RBX);
    if (iVar2 != 0) goto LAB_0015b9e4;
    lVar10 = lVar10 + 1;
    puVar4 = puVar4 + 1;
    piVar9 = piVar9 + 1;
  } while (lVar10 != 10);
  puVar8 = (undefined8 *)uv_default_loop();
  lVar10 = 0;
  uv_run(puVar8,0);
  do {
    if (*(int *)((long)callback_counts + lVar10) != 1) goto LAB_0015b9e9;
    lVar10 = lVar10 + 4;
  } while (lVar10 != 0x28);
  uVar3 = uv_default_loop();
  uv_walk(uVar3,close_walk_cb,0);
  uv_run(uVar3,0);
  puVar8 = (undefined8 *)uv_default_loop();
  iVar2 = uv_loop_close();
  if (iVar2 == 0) {
    return 0;
  }
LAB_0015b9ee:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar9 = (int *)*puVar8;
  piVar6 = callback_counts;
  psVar7 = &closedir_req.bufsml[1].len;
  lVar10 = 0;
  do {
    psVar7 = psVar7 + 0x14;
    if (psVar7 == puVar8) goto LAB_0015ba2b;
    piVar6 = piVar6 + 1;
    lVar10 = lVar10 + 1;
  } while (lVar10 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar10 = extraout_RDX_02;
LAB_0015ba2b:
  if (*piVar9 == (int)lVar10) {
    *piVar6 = *piVar6 + 1;
    free(piVar9);
    iVar2 = uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar2;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(piVar9,0);
  return iVar2;
LAB_0015b9e9:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b9ee;
}

Assistant:

TEST_IMPL(getaddrinfo_fail) {
  uv_getaddrinfo_t req;

  ASSERT(UV_EINVAL == uv_getaddrinfo(uv_default_loop(),
                                     &req,
                                     (uv_getaddrinfo_cb) abort,
                                     NULL,
                                     NULL,
                                     NULL));

  /* Use a FQDN by ending in a period */
  ASSERT(0 == uv_getaddrinfo(uv_default_loop(),
                             &req,
                             getaddrinfo_fail_cb,
                             "xyzzy.xyzzy.xyzzy.",
                             NULL,
                             NULL));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT(fail_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}